

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::EncryptAes256
          (ByteData *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *key,string *data)

{
  allocator<unsigned_char> *this;
  pointer puVar1;
  size_type sVar2;
  CfdException *pCVar3;
  ulong uVar4;
  uchar *puVar5;
  void *__src;
  size_t __n;
  uchar *bytes;
  size_type bytes_len;
  uchar *bytes_out;
  size_type len;
  allocator local_f1;
  string local_f0;
  CfdSourceLocation local_d0;
  int local_b8;
  allocator<unsigned_char> local_b1;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  size_t data_size;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  string *local_20;
  string *data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_local;
  
  local_20 = data;
  data_local = (string *)key;
  key_local = &__return_storage_ptr__->data_;
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)key);
  if (sVar2 != 0x20) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x222;
    local_38.funcname = "EncryptAes256";
    logger::warn<>(&local_38,"wally_aes key size NG.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_58,"EncryptAes256 key size error.",&local_59);
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,&local_58);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)::std::__cxx11::string::size();
  uVar4 = ::std::__cxx11::string::size();
  if ((uVar4 & 0xf) != 0) {
    uVar4 = ::std::__cxx11::string::size();
    input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(((uVar4 >> 4) + 1) * 0x10);
  }
  puVar1 = input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  this = (allocator<unsigned_char> *)
         ((long)&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<unsigned_char>::allocator(this);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (local_90,(size_type)puVar1,this);
  ::std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  ::std::allocator<unsigned_char>::allocator(&local_b1);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,(size_type)puVar1,
             &local_b1);
  ::std::allocator<unsigned_char>::~allocator(&local_b1);
  puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_90);
  __src = (void *)::std::__cxx11::string::data();
  __n = ::std::__cxx11::string::size();
  memcpy(puVar5,__src,__n);
  puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)data_local);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)data_local);
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_90);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_90);
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  local_b8 = wally_aes(puVar5,sVar2,bytes,bytes_len,1,bytes_out,len);
  if (local_b8 != 0) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x237;
    local_d0.funcname = "EncryptAes256";
    logger::warn<int&>(&local_d0,"wally_aes NG[{}].",&local_b8);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f0,"EncryptAes256 error.",&local_f1);
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,&local_f0);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_90);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::EncryptAes256(
    const std::vector<uint8_t> &key, const std::string &data) {
  if (key.size() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(kCfdIllegalStateError, "EncryptAes256 key size error.");
  }

  size_t data_size = data.size();
  if (data.size() % kAesBlockLength != 0) {
    data_size = (((data.size() / kAesBlockLength) + 1) * kAesBlockLength);
  }
  std::vector<uint8_t> input(data_size);
  std::vector<uint8_t> output(data_size);

  // To fill the end with 0
  memcpy(
      input.data(), reinterpret_cast<const uint8_t *>(data.data()),
      data.size());

  // Encrypt data using AES (ECB mode, no padding).
  int ret = wally_aes(
      key.data(), key.size(), input.data(), input.size(), AES_FLAG_ENCRYPT,
      output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "EncryptAes256 error.");
  }

  return ByteData(output);
}